

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::XmlReporter::StartSection(XmlReporter *this,string *sectionName,string *description)

{
  XmlWriter *pXVar1;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *description_local;
  string *sectionName_local;
  XmlReporter *this_local;
  
  local_20 = description;
  description_local = sectionName;
  sectionName_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Section",&local_41);
  pXVar1 = XmlWriter::startElement(&this->m_xml,&local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"name",&local_79);
  pXVar1 = XmlWriter::writeAttribute(pXVar1,&local_78,description_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"description",&local_a1);
  XmlWriter::writeAttribute(pXVar1,&local_a0,local_20);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

virtual void StartSection( const std::string& sectionName, const std::string& description ) {
            m_xml.startElement( "Section" )
                .writeAttribute( "name", sectionName )
                .writeAttribute( "description", description );
        }